

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

ssize_t __thiscall
ymfm::opl_registers_base<1>::write(opl_registers_base<1> *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  byte bVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t *in_R8;
  uint32_t local_3c;
  uint32_t *opmask_local;
  uint32_t *channel_local;
  uint8_t data_local;
  uint16_t index_local;
  opl_registers_base<1> *this_local;
  
  bVar2 = (byte)__buf;
  uVar1 = (ushort)__fd;
  if (uVar1 < 0x100) {
    if ((uVar1 == 4) && (uVar4 = bitfield((uint)bVar2,7,1), uVar4 != 0)) {
      this->m_regdata[4] = this->m_regdata[4] | 0x80;
    }
    else {
      this->m_regdata[uVar1] = bVar2;
    }
    if (uVar1 == 0xbd) {
      *(undefined4 *)__n = 0xff;
      uVar4 = bitfield((uint)bVar2,5,1);
      if (uVar4 == 0) {
        local_3c = 0;
      }
      else {
        local_3c = bitfield((uint)bVar2,0,5);
      }
      *in_R8 = local_3c;
      this_local._7_1_ = 1;
    }
    else {
      puVar3 = (uint32_t *)0x0;
      if (((__fd & 0xf0U) == 0xb0) &&
         (*(uint *)__n = __fd & 0xf, puVar3 = (uint32_t *)__n, *(uint *)__n < 9)) {
        uVar5 = bitfield((uint)bVar2,5,1);
        uVar4 = 0;
        if (uVar5 != 0) {
          uVar4 = 0xf;
        }
        *in_R8 = uVar4;
        this_local._7_1_ = 1;
      }
      else {
        in_R8 = puVar3;
        this_local._7_1_ = 0;
      }
    }
    return CONCAT71((int7)((ulong)in_R8 >> 8),this_local._7_1_);
  }
  __assert_fail("index < REGISTERS",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/chips/ymfm/ymfm_opl.cpp"
                ,0xc5,
                "bool ymfm::opl_registers_base<1>::write(uint16_t, uint8_t, uint32_t &, uint32_t &) [Revision = 1]"
               );
}

Assistant:

bool opl_registers_base<Revision>::write(uint16_t index, uint8_t data, uint32_t &channel, uint32_t &opmask)
{
	assert(index < REGISTERS);

	// writes to the mode register with high bit set ignore the low bits
	if (index == REG_MODE && bitfield(data, 7) != 0)
		m_regdata[index] |= 0x80;
	else
		m_regdata[index] = data;

	// handle writes to the rhythm keyons
	if (index == 0xbd)
	{
		channel = RHYTHM_CHANNEL;
		opmask = bitfield(data, 5) ? bitfield(data, 0, 5) : 0;
		return true;
	}

	// handle writes to the channel keyons
	if ((index & 0xf0) == 0xb0)
	{
		channel = index & 0x0f;
		if (channel < 9)
		{
			if (IsOpl3Plus)
				channel += 9 * bitfield(index, 8);
			opmask = bitfield(data, 5) ? 15 : 0;
			return true;
		}
	}
	return false;
}